

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  ZSTD_cwksp *ws;
  undefined4 uVar2;
  undefined4 uVar5;
  size_t sVar3;
  ZSTD_allocFunction p_Var4;
  bool bVar6;
  undefined4 uVar7;
  ldmParams_t params_01;
  ZSTD_customMem customMem;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  ZSTD_strategy ZVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong bytes;
  size_t sVar18;
  size_t sVar19;
  seqDef *psVar20;
  ldmEntry_t *__s;
  rawSeq *prVar21;
  ZSTD_Sequence *pZVar22;
  BYTE *pBVar23;
  void *pvVar24;
  ZSTD_compressedBlockState_t *pZVar25;
  U32 *pUVar26;
  ZSTD_indexResetPolicy_e forceResetIndex;
  U64 UVar27;
  ulong srcSize;
  size_t err_code;
  size_t local_68;
  size_t local_50;
  
  zc->isFirstBlock = 1;
  switchD_0036ec8a::default(&zc->appliedParams,params,0xd8);
  params_00 = &(zc->appliedParams).ldmParams;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
  }
  UVar27 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= UVar27) {
    UVar27 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    UVar27 = 1;
  }
  srcSize = (zc->appliedParams).maxBlockSize;
  if (UVar27 <= srcSize) {
    srcSize = UVar27;
  }
  local_68 = 0;
  bytes = srcSize / (4 - (ulong)((zc->appliedParams).cParams.minMatch == 3 ||
                                (zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0))
  ;
  local_50 = 0;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      local_68 = ZSTD_compressBound(srcSize);
      local_68 = local_68 + 1;
    }
    else {
      local_68 = 0;
    }
    local_50 = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      local_50 = UVar27 + srcSize;
    }
  }
  cParams = &(zc->appliedParams).cParams;
  uVar2 = (zc->appliedParams).ldmParams.hashRateLog;
  uVar5 = (zc->appliedParams).ldmParams.windowLog;
  params_01.windowLog = uVar5;
  params_01.hashRateLog = uVar2;
  uVar7 = (zc->appliedParams).ldmParams.minMatchLength;
  uVar8 = params_00->enableLdm;
  uVar9 = params_00->hashLog;
  uVar10 = params_00->bucketSizeLog;
  params_01.bucketSizeLog = uVar10;
  params_01.hashLog = uVar9;
  params_01.enableLdm = uVar8;
  params_01.minMatchLength = uVar7;
  sVar18 = ZSTD_ldm_getMaxNbSeq(params_01,srcSize);
  forceResetIndex = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    forceResetIndex = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  sVar19 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (cParams,params_00,(uint)(zc->staticSize != 0),
                      (zc->appliedParams).useRowMatchFinder,local_50,local_68,pledgedSrcSize,
                      (uint)((zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0),
                      (zc->appliedParams).maxBlockSize);
  if (0xffffffffffffff88 < sVar19) {
    return sVar19;
  }
  sVar3 = zc->staticSize;
  if (sVar3 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar24 = (zc->workspace).workspace;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < sVar19 * 3) {
    bVar6 = false;
  }
  else {
    bVar6 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  ws = &zc->workspace;
  if (((ulong)((long)(zc->workspace).workspaceEnd - (long)pvVar24) < sVar19) || (bVar6)) {
    if (sVar3 != 0) {
      return 0xffffffffffffffc0;
    }
    (zc->workspace).initOnceStart = (void *)0x0;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x39 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    ws->workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    customMem.customFree._4_4_ = (int)((ulong)(zc->customMem).customFree >> 0x20);
    customMem._0_12_ = *(undefined1 (*) [12])&zc->customMem;
    customMem.opaque = (zc->customMem).opaque;
    ZSTD_customFree(pvVar24,customMem);
    p_Var4 = (zc->customMem).customAlloc;
    if (p_Var4 == (ZSTD_allocFunction)0x0) {
      pvVar24 = malloc(sVar19);
    }
    else {
      pvVar24 = (*p_Var4)((zc->customMem).opaque,sVar19);
    }
    if (pvVar24 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    ZSTD_cwksp_init(ws,pvVar24,sVar19,ZSTD_cwksp_dynamic_alloc);
    pZVar25 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
    (zc->blockState).prevCBlock = pZVar25;
    if (pZVar25 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar25 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
    (zc->blockState).nextCBlock = pZVar25;
    if (pZVar25 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar26 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x22d8);
    zc->entropyWorkspace = pUVar26;
    if (pUVar26 == (U32 *)0x0) {
      return 0xffffffffffffffc0;
    }
    forceResetIndex = ZSTDirp_reset;
  }
  ZSTD_cwksp_clear(ws);
  uVar14 = cParams->windowLog;
  uVar15 = cParams->chainLog;
  uVar16 = (zc->appliedParams).cParams.hashLog;
  uVar17 = (zc->appliedParams).cParams.searchLog;
  uVar11 = (zc->appliedParams).cParams.minMatch;
  uVar12 = (zc->appliedParams).cParams.targetLength;
  ZVar13 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar11;
  (zc->blockState).matchState.cParams.targetLength = uVar12;
  (zc->blockState).matchState.cParams.strategy = ZVar13;
  (zc->blockState).matchState.cParams.windowLog = uVar14;
  (zc->blockState).matchState.cParams.chainLog = uVar15;
  (zc->blockState).matchState.cParams.hashLog = uVar16;
  (zc->blockState).matchState.cParams.searchLog = uVar17;
  (zc->blockState).matchState.prefetchCDictTables =
       (uint)((zc->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = srcSize;
  XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  ZSTD_reset_compressedBlockState((zc->blockState).prevCBlock);
  sVar19 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,ws,cParams,(zc->appliedParams).useRowMatchFinder,
                      crp,forceResetIndex,ZSTD_resetTarget_CCtx);
  if (sVar19 < 0xffffffffffffff89) {
    psVar20 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws,bytes * 8);
    (zc->seqStore).sequencesStart = psVar20;
    if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      sVar19 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
      __s = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws,sVar19);
      (zc->ldmState).hashTable = __s;
      memset(__s,0,sVar19);
      prVar21 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws,sVar18 * 0xc);
      zc->ldmSequences = prVar21;
      zc->maxNbLdmSequences = sVar18;
      *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
      (zc->ldmState).window.base = " ";
      (zc->ldmState).window.dictBase = " ";
      (zc->ldmState).window.dictLimit = 2;
      (zc->ldmState).window.lowLimit = 2;
      (zc->ldmState).window.nextSrc = (BYTE *)"id-ce-certificatePolicies";
      (zc->ldmState).loadedDictEnd = 0;
    }
    if ((zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0) {
      sVar18 = (srcSize >> 10) + srcSize / 3 + 2;
      zc->extSeqBufCapacity = sVar18;
      pZVar22 = (ZSTD_Sequence *)ZSTD_cwksp_reserve_aligned(ws,sVar18 * 0x10);
      zc->extSeqBuf = pZVar22;
    }
    pBVar23 = ZSTD_cwksp_reserve_buffer(ws,srcSize + 0x20);
    (zc->seqStore).litStart = pBVar23;
    (zc->seqStore).maxNbLit = srcSize;
    zc->bufferedPolicy = zbuff;
    zc->inBuffSize = local_50;
    pBVar23 = ZSTD_cwksp_reserve_buffer(ws,local_50);
    zc->inBuff = (char *)pBVar23;
    zc->outBuffSize = local_68;
    pBVar23 = ZSTD_cwksp_reserve_buffer(ws,local_68);
    zc->outBuff = (char *)pBVar23;
    if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      sVar18 = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                      (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
      pBVar23 = ZSTD_cwksp_reserve_buffer(ws,sVar18);
      (zc->ldmState).bucketOffsets = pBVar23;
      memset(pBVar23,0,sVar18);
    }
    (zc->externSeqStore).posInSequence = 0;
    (zc->externSeqStore).size = 0;
    (zc->externSeqStore).seq = (rawSeq *)0x0;
    (zc->externSeqStore).pos = 0;
    (zc->externSeqStore).capacity = 0;
    (zc->seqStore).maxNbSeq = bytes;
    pBVar23 = ZSTD_cwksp_reserve_buffer(ws,bytes);
    (zc->seqStore).llCode = pBVar23;
    pBVar23 = ZSTD_cwksp_reserve_buffer(ws,bytes);
    (zc->seqStore).mlCode = pBVar23;
    pBVar23 = ZSTD_cwksp_reserve_buffer(ws,bytes);
    (zc->seqStore).ofCode = pBVar23;
    zc->initialized = 1;
    sVar19 = 0;
  }
  return sVar19;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, ZSTD_hasExtSeqProd(params));
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, ZSTD_hasExtSeqProd(params), params->maxBlockSize);

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            int resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (ZSTD_hasExtSeqProd(params)) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->extSeqBufCapacity = maxNbExternalSeq;
            zc->extSeqBuf =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}